

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::ComputeLinkTypeInfo(cmComputeLinkInformation *this)

{
  cmState *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  LinkType LVar3;
  cmValue cVar4;
  cmValue cVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value;
  string shared_link_type_flag_var;
  string static_link_type_flag_var;
  string local_c0;
  undefined8 local_a0;
  char *local_98;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS","");
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,&local_c0);
  this->ArchivesMayBeShared = bVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  this->LinkTypeEnabled = false;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == EXECUTABLE) {
    pcVar6 = "EXE";
  }
  else if (TVar2 == SHARED_LIBRARY) {
    pcVar6 = "SHARED_LIBRARY";
  }
  else {
    if (TVar2 != MODULE_LIBRARY) {
      bVar1 = true;
      pcVar6 = (char *)0x0;
      goto LAB_00434068;
    }
    pcVar6 = "SHARED_MODULE";
  }
  bVar1 = false;
LAB_00434068:
  if (bVar1) {
    cVar4.Value = (string *)0x0;
    cVar5.Value = (string *)0x0;
  }
  else {
    local_c0.field_2._M_allocated_capacity = strlen(pcVar6);
    local_c0._M_dataplus._M_p = (pointer)0x6;
    local_c0._M_string_length = 0x771402;
    local_a0 = 0xd;
    local_98 = "_LINK_STATIC_";
    local_88 = (this->LinkLanguage)._M_dataplus._M_p;
    local_90 = (this->LinkLanguage)._M_string_length;
    local_80 = 6;
    local_78 = "_FLAGS";
    views._M_len = 5;
    views._M_array = (iterator)&local_c0;
    local_c0.field_2._8_8_ = pcVar6;
    cmCatViews_abi_cxx11_(&local_50,views);
    cVar5 = cmMakefile::GetDefinition(this->Makefile,&local_50);
    local_c0.field_2._M_allocated_capacity = strlen(pcVar6);
    local_c0._M_dataplus._M_p = (pointer)0x6;
    local_c0._M_string_length = 0x771402;
    local_a0 = 0xe;
    local_98 = "_LINK_DYNAMIC_";
    local_88 = (this->LinkLanguage)._M_dataplus._M_p;
    local_90 = (this->LinkLanguage)._M_string_length;
    local_80 = 6;
    local_78 = "_FLAGS";
    views_00._M_len = 5;
    views_00._M_array = (iterator)&local_c0;
    local_c0.field_2._8_8_ = pcVar6;
    cmCatViews_abi_cxx11_(&local_70,views_00);
    cVar4 = cmMakefile::GetDefinition(this->Makefile,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((cVar5.Value != (string *)0x0) && ((cVar5.Value)->_M_string_length != 0)) &&
      (cVar4.Value != (string *)0x0)) && ((cVar4.Value)->_M_string_length != 0)) {
    this->LinkTypeEnabled = true;
    std::__cxx11::string::_M_assign((string *)&this->StaticLinkTypeFlag);
    std::__cxx11::string::_M_assign((string *)&this->SharedLinkTypeFlag);
  }
  this_01 = this->Target;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"LINK_SEARCH_START_STATIC","")
  ;
  cVar5 = cmGeneratorTarget::GetProperty(this_01,&local_c0);
  pcVar6 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    pcVar6 = extraout_RDX_00;
  }
  if (cVar5.Value == (string *)0x0) {
    LVar3 = LinkShared;
  }
  else {
    value._M_str = pcVar6;
    value._M_len = (size_t)((cVar5.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar5.Value)->_M_string_length,value);
    LVar3 = LinkShared - bVar1;
  }
  this->StartLinkType = LVar3;
  this->CurrentLinkType = LVar3;
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeLinkTypeInfo()
{
  // Check whether archives may actually be shared libraries.
  this->ArchivesMayBeShared =
    this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
      "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");

  // First assume we cannot do link type stuff.
  this->LinkTypeEnabled = false;

  // Lookup link type selection flags.
  cmValue static_link_type_flag = nullptr;
  cmValue shared_link_type_flag = nullptr;
  const char* target_type_str = nullptr;
  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      target_type_str = "EXE";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      target_type_str = "SHARED_LIBRARY";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      target_type_str = "SHARED_MODULE";
      break;
    default:
      break;
  }
  if (target_type_str) {
    std::string static_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_STATIC_", this->LinkLanguage,
               "_FLAGS");
    static_link_type_flag =
      this->Makefile->GetDefinition(static_link_type_flag_var);

    std::string shared_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_DYNAMIC_", this->LinkLanguage,
               "_FLAGS");
    shared_link_type_flag =
      this->Makefile->GetDefinition(shared_link_type_flag_var);
  }

  // We can support link type switching only if all needed flags are
  // known.
  if (cmNonempty(static_link_type_flag) && cmNonempty(shared_link_type_flag)) {
    this->LinkTypeEnabled = true;
    this->StaticLinkTypeFlag = *static_link_type_flag;
    this->SharedLinkTypeFlag = *shared_link_type_flag;
  }

  // Lookup the starting link type from the target (linked statically?).
  cmValue lss = this->Target->GetProperty("LINK_SEARCH_START_STATIC");
  this->StartLinkType = cmIsOn(lss) ? LinkStatic : LinkShared;
  this->CurrentLinkType = this->StartLinkType;
}